

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall
QMimeXMLProvider::addParents(QMimeXMLProvider *this,QString *mime,QStringList *result)

{
  bool bVar1;
  iterator args;
  iterator iVar2;
  CaseSensitivity in_R8D;
  long in_FS_OFFSET;
  QStringView str;
  QArrayDataPointer<QString> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,_QList<QString>_>::value((QList<QString> *)&QStack_38,&this->m_parents,mime);
  args = QList<QString>::begin((QList<QString> *)&QStack_38);
  iVar2 = QList<QString>::end((QList<QString> *)&QStack_38);
  for (; args.i != iVar2.i; args.i = args.i + 1) {
    str.m_data = (storage_type_conflict *)0x1;
    str.m_size = (qsizetype)((args.i)->d).ptr;
    bVar1 = QtPrivate::QStringList_contains
                      ((QtPrivate *)result,(QStringList *)((args.i)->d).size,str,in_R8D);
    if (!bVar1) {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)result,(result->d).size,args.i);
      QList<QString>::end(result);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addParents(const QString &mime, QStringList &result)
{
    for (const QString &parent : m_parents.value(mime)) {
        if (!result.contains(parent))
            result.append(parent);
    }
}